

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

void logger_file(char *line)

{
  IOHANDLE __s;
  size_t sVar1;
  
  __s = logfile;
  sVar1 = strlen(line);
  fwrite(line,1,sVar1 & 0xffffffff,(FILE *)__s);
  fputc(10,(FILE *)logfile);
  fflush((FILE *)logfile);
  return;
}

Assistant:

static void logger_file(const char *line)
{
	io_write(logfile, line, str_length(line));
	io_write_newline(logfile);
	io_flush(logfile);
}